

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2NullVsEmptyStringSubmatches(void)

{
  bool bVar1;
  long lVar2;
  StringPiece *x;
  undefined8 uStack_300;
  StringPiece matches [4];
  LogMessageFatal local_2b0;
  StringPiece empty;
  StringPiece null;
  RE2 re;
  
  RE2::RE2(&re,"()|(foo)");
  if (re.error_code_ != NoError) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x597);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,"Check failed: re.ok()");
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  lVar2 = 0;
  do {
    *(undefined8 *)((long)&matches[0].ptr_ + lVar2) = 0;
    *(undefined4 *)((long)&matches[0].length_ + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  for (lVar2 = 8; lVar2 != 0x48; lVar2 = lVar2 + 0x10) {
    *(char **)((long)&uStack_300 + lVar2) = "bar";
    *(undefined4 *)((long)&matches[0].ptr_ + lVar2) = 3;
  }
  null.ptr_ = (char *)0x0;
  null.length_ = 0;
  bVar1 = RE2::Match(&re,&null,0,0,UNANCHORED,matches,4);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5a1);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,
                    "Check failed: re.Match(null, 0, null.size(), RE2::UNANCHORED, matches, arraysize(matches))"
                   );
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 0x10) {
    local_2b0.super_LogMessage._0_8_ = (char *)0x0;
    x = (StringPiece *)((long)&matches[0].ptr_ + lVar2);
    local_2b0.super_LogMessage._8_4_ = 0;
    bVar1 = StringPiece::_equal(x,(StringPiece *)&local_2b0);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                (&local_2b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x5a3);
      std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,"Check failed: matches[i] == NULL"
                     );
      LogMessageFatal::~LogMessageFatal(&local_2b0);
    }
    if (x->ptr_ != (char *)0x0) {
      LogMessageFatal::LogMessageFatal
                (&local_2b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x5a4);
      std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,
                      "Check failed: matches[i].data() == NULL");
      LogMessageFatal::~LogMessageFatal(&local_2b0);
    }
    local_2b0.super_LogMessage._0_8_ = "";
    local_2b0.super_LogMessage._8_4_ = 0;
    bVar1 = StringPiece::_equal(x,(StringPiece *)&local_2b0);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                (&local_2b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x5a5);
      std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,"Check failed: matches[i] == \"\""
                     );
      LogMessageFatal::~LogMessageFatal(&local_2b0);
    }
  }
  for (lVar2 = 8; lVar2 != 0x48; lVar2 = lVar2 + 0x10) {
    *(char **)((long)&uStack_300 + lVar2) = "bar";
    *(undefined4 *)((long)&matches[0].ptr_ + lVar2) = 3;
  }
  empty.ptr_ = "";
  empty.length_ = 0;
  bVar1 = RE2::Match(&re,&empty,0,0,UNANCHORED,matches,4);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5ad);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,
                    "Check failed: re.Match(empty, 0, empty.size(), RE2::UNANCHORED, matches, arraysize(matches))"
                   );
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  local_2b0.super_LogMessage._0_8_ = (char *)0x0;
  local_2b0.super_LogMessage._8_4_ = 0;
  bVar1 = StringPiece::_equal(matches,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5ae);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,"Check failed: matches[0] == NULL");
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  if (matches[0].ptr_ == (char *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5af);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,
                    "Check failed: matches[0].data() != NULL");
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  local_2b0.super_LogMessage._0_8_ = "";
  local_2b0.super_LogMessage._8_4_ = 0;
  bVar1 = StringPiece::_equal(matches,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b0);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,"Check failed: matches[0] == \"\"");
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  local_2b0.super_LogMessage._0_8_ = (char *)0x0;
  local_2b0.super_LogMessage._8_4_ = 0;
  bVar1 = StringPiece::_equal(matches + 1,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b1);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,"Check failed: matches[1] == NULL");
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  if (matches[1].ptr_ == (char *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b2);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,
                    "Check failed: matches[1].data() != NULL");
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  local_2b0.super_LogMessage._0_8_ = "";
  local_2b0.super_LogMessage._8_4_ = 0;
  bVar1 = StringPiece::_equal(matches + 1,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b3);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,"Check failed: matches[1] == \"\"");
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  local_2b0.super_LogMessage._0_8_ = (char *)0x0;
  local_2b0.super_LogMessage._8_4_ = 0;
  bVar1 = StringPiece::_equal(matches + 2,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b4);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,"Check failed: matches[2] == NULL");
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  if (matches[2].ptr_ != (char *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b5);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,
                    "Check failed: matches[2].data() == NULL");
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  local_2b0.super_LogMessage._0_8_ = "";
  local_2b0.super_LogMessage._8_4_ = 0;
  bVar1 = StringPiece::_equal(matches + 2,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b6);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,"Check failed: matches[2] == \"\"");
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  local_2b0.super_LogMessage._0_8_ = (char *)0x0;
  local_2b0.super_LogMessage._8_4_ = 0;
  bVar1 = StringPiece::_equal(matches + 3,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b7);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,"Check failed: matches[3] == NULL");
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  if (matches[3].ptr_ != (char *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b8);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,
                    "Check failed: matches[3].data() == NULL");
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  local_2b0.super_LogMessage._0_8_ = "";
  local_2b0.super_LogMessage._8_4_ = 0;
  bVar1 = StringPiece::_equal(matches + 3,(StringPiece *)&local_2b0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b9);
    std::operator<<((ostream *)&local_2b0.super_LogMessage.str_,"Check failed: matches[3] == \"\"");
    LogMessageFatal::~LogMessageFatal(&local_2b0);
  }
  RE2::~RE2(&re);
  return;
}

Assistant:

TEST(RE2, NullVsEmptyStringSubmatches) {
  RE2 re("()|(foo)");
  EXPECT_TRUE(re.ok());

  // matches[0] is overall match, [1] is (), [2] is (foo), [3] is nonexistent.
  StringPiece matches[4];

  for (int i = 0; i < arraysize(matches); i++)
    matches[i] = "bar";

  StringPiece null;
  EXPECT_TRUE(re.Match(null, 0, null.size(), RE2::UNANCHORED,
                       matches, arraysize(matches)));
  for (int i = 0; i < arraysize(matches); i++) {
    EXPECT_TRUE(matches[i] == NULL);
    EXPECT_TRUE(matches[i].data() == NULL);  // always null
    EXPECT_TRUE(matches[i] == "");
  }

  for (int i = 0; i < arraysize(matches); i++)
    matches[i] = "bar";

  StringPiece empty("");
  EXPECT_TRUE(re.Match(empty, 0, empty.size(), RE2::UNANCHORED,
                       matches, arraysize(matches)));
  EXPECT_TRUE(matches[0] == NULL);
  EXPECT_TRUE(matches[0].data() != NULL);  // empty, not null
  EXPECT_TRUE(matches[0] == "");
  EXPECT_TRUE(matches[1] == NULL);
  EXPECT_TRUE(matches[1].data() != NULL);  // empty, not null
  EXPECT_TRUE(matches[1] == "");
  EXPECT_TRUE(matches[2] == NULL);
  EXPECT_TRUE(matches[2].data() == NULL);
  EXPECT_TRUE(matches[2] == "");
  EXPECT_TRUE(matches[3] == NULL);
  EXPECT_TRUE(matches[3].data() == NULL);
  EXPECT_TRUE(matches[3] == "");
}